

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O1

void __thiscall
slang::ast::SequenceRepetition::SequenceRepetition
          (SequenceRepetition *this,SequenceRepetitionSyntax *syntax,ASTContext *context)

{
  TokenKind TVar1;
  Kind KVar2;
  SequenceRange SVar3;
  
  this->kind = Consecutive;
  (this->range).min = 1;
  (this->range).max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_engaged = false;
  TVar1 = (syntax->op).kind;
  if (TVar1 == Plus) {
    this->kind = Consecutive;
    (this->range).min = 1;
  }
  else {
    if (TVar1 == Equals) {
      KVar2 = Nonconsecutive;
    }
    else if (TVar1 == MinusArrow) {
      KVar2 = GoTo;
    }
    else {
      KVar2 = Consecutive;
    }
    this->kind = KVar2;
    if (syntax->selector != (SelectorSyntax *)0x0) {
      SVar3 = SequenceRange::fromSyntax(syntax->selector,context,true);
      (this->range).min = (int)SVar3._0_8_;
      (this->range).max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_payload =
           (_Storage<unsigned_int,_true>)(int)((ulong)SVar3._0_8_ >> 0x20);
      (this->range).max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_engaged =
           SVar3.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_int>._M_engaged;
    }
  }
  return;
}

Assistant:

SequenceRepetition::SequenceRepetition(const SequenceRepetitionSyntax& syntax,
                                       const ASTContext& context) {
    switch (syntax.op.kind) {
        case TokenKind::Equals:
            kind = Nonconsecutive;
            break;
        case TokenKind::MinusArrow:
            kind = GoTo;
            break;
        case TokenKind::Plus:
            // No expressions allowed for plus.
            kind = Consecutive;
            range.min = 1;
            return;
        default:
            kind = Consecutive;
            break;
    }

    if (syntax.selector)
        range = SequenceRange::fromSyntax(*syntax.selector, context, /* allowUnbounded */ true);
}